

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  int *piVar1;
  uint *puVar2;
  ImVec2 IVar3;
  ImU32 IVar4;
  int iVar5;
  ImGuiID IVar6;
  char *pcVar7;
  uint *__dest;
  size_t sVar8;
  int iVar9;
  int iVar10;
  
  (this->ContentSizeExplicit).x = 0.0;
  (this->ContentSizeExplicit).y = 0.0;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  (this->SizeFull).x = 0.0;
  (this->SizeFull).y = 0.0;
  (this->ContentSize).x = 0.0;
  (this->ContentSize).y = 0.0;
  (this->Pos).x = 0.0;
  (this->Pos).y = 0.0;
  (this->Size).x = 0.0;
  (this->Size).y = 0.0;
  (this->Scroll).x = 0.0;
  (this->Scroll).y = 0.0;
  (this->ScrollMax).x = 0.0;
  (this->ScrollMax).y = 0.0;
  (this->ScrollTarget).x = 0.0;
  (this->ScrollTarget).y = 0.0;
  (this->ScrollTargetCenterRatio).x = 0.0;
  (this->ScrollTargetCenterRatio).y = 0.0;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  (this->SetWindowPosVal).x = 0.0;
  (this->SetWindowPosVal).y = 0.0;
  (this->SetWindowPosPivot).x = 0.0;
  (this->SetWindowPosPivot).y = 0.0;
  (this->IDStack).Size = 0;
  (this->IDStack).Capacity = 0;
  (this->IDStack).Data = (uint *)0x0;
  ImGuiWindowTempData::ImGuiWindowTempData(&this->DC);
  (this->OuterRectClipped).Min.x = 3.4028235e+38;
  (this->OuterRectClipped).Min.y = 3.4028235e+38;
  (this->OuterRectClipped).Max.x = -3.4028235e+38;
  (this->OuterRectClipped).Max.y = -3.4028235e+38;
  (this->InnerRect).Min.x = 3.4028235e+38;
  (this->InnerRect).Min.y = 3.4028235e+38;
  (this->InnerRect).Max.x = -3.4028235e+38;
  (this->InnerRect).Max.y = -3.4028235e+38;
  (this->InnerClipRect).Min.x = 3.4028235e+38;
  (this->InnerClipRect).Min.y = 3.4028235e+38;
  (this->InnerClipRect).Max.x = -3.4028235e+38;
  (this->InnerClipRect).Max.y = -3.4028235e+38;
  (this->WorkRect).Min.x = 3.4028235e+38;
  (this->WorkRect).Min.y = 3.4028235e+38;
  (this->WorkRect).Max.x = -3.4028235e+38;
  (this->WorkRect).Max.y = -3.4028235e+38;
  (this->ClipRect).Min.x = 3.4028235e+38;
  (this->ClipRect).Min.y = 3.4028235e+38;
  (this->ClipRect).Max.x = -3.4028235e+38;
  (this->ClipRect).Max.y = -3.4028235e+38;
  (this->ContentsRegionRect).Min.x = 3.4028235e+38;
  (this->ContentsRegionRect).Min.y = 3.4028235e+38;
  (this->ContentsRegionRect).Max.x = -3.4028235e+38;
  (this->ContentsRegionRect).Max.y = -3.4028235e+38;
  ImGuiMenuColumns::ImGuiMenuColumns(&this->MenuColumns);
  (this->ColumnsStorage).Size = 0;
  (this->ColumnsStorage).Capacity = 0;
  (this->ColumnsStorage).Data = (ImGuiColumns *)0x0;
  (this->StateStorage).Data.Size = 0;
  (this->StateStorage).Data.Capacity = 0;
  (this->StateStorage).Data.Data = (ImGuiStoragePair *)0x0;
  ImDrawList::ImDrawList(&this->DrawListInst,&context->DrawListSharedData);
  this->NavRectRel[1].Min.x = 3.4028235e+38;
  this->NavRectRel[1].Min.y = 3.4028235e+38;
  this->NavRectRel[1].Max.x = -3.4028235e+38;
  this->NavRectRel[1].Max.y = -3.4028235e+38;
  this->NavRectRel[0].Min.x = 3.4028235e+38;
  this->NavRectRel[0].Min.y = 3.4028235e+38;
  this->NavRectRel[0].Max.x = -3.4028235e+38;
  this->NavRectRel[0].Max.y = -3.4028235e+38;
  pcVar7 = ImStrdup(name);
  this->Name = pcVar7;
  IVar4 = ImHashStr(name,0,0);
  this->ID = IVar4;
  iVar9 = (this->IDStack).Size;
  if (iVar9 == (this->IDStack).Capacity) {
    if (iVar9 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar9 / 2 + iVar9;
    }
    iVar10 = iVar9 + 1;
    if (iVar9 + 1 < iVar5) {
      iVar10 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
    puVar2 = (this->IDStack).Data;
    if (puVar2 != (uint *)0x0) {
      memcpy(__dest,puVar2,(long)(this->IDStack).Size << 2);
      puVar2 = (this->IDStack).Data;
      if ((puVar2 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
    }
    (this->IDStack).Data = __dest;
    (this->IDStack).Capacity = iVar10;
    IVar4 = this->ID;
    iVar9 = (this->IDStack).Size;
  }
  else {
    __dest = (this->IDStack).Data;
  }
  __dest[iVar9] = IVar4;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  this->Flags = 0;
  (this->Pos).x = 0.0;
  *(undefined8 *)&(this->Pos).y = 0;
  *(undefined8 *)&(this->Size).y = 0;
  *(undefined8 *)&(this->SizeFull).y = 0;
  *(undefined8 *)&(this->ContentSize).y = 0;
  *(undefined8 *)&(this->ContentSizeExplicit).y = 0;
  (this->WindowPadding).x = 0.0;
  (this->WindowPadding).y = 0.0;
  this->WindowRounding = 0.0;
  this->WindowBorderSize = 0.0;
  sVar8 = strlen(name);
  this->NameBufLen = (int)sVar8 + 1;
  IVar6 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar6;
  this->ChildId = 0;
  (this->Scroll).x = 0.0;
  (this->Scroll).y = 0.0;
  (this->ScrollTarget).x = 3.4028235e+38;
  (this->ScrollTarget).y = 3.4028235e+38;
  (this->ScrollTargetCenterRatio).x = 0.5;
  (this->ScrollTargetCenterRatio).y = 0.5;
  (this->ScrollbarSizes).x = 0.0;
  (this->ScrollbarSizes).y = 0.0;
  this->ScrollbarX = false;
  this->ScrollbarY = false;
  this->Active = false;
  this->WasActive = false;
  this->WriteAccessed = false;
  this->Collapsed = false;
  this->WantCollapseToggle = false;
  this->SkipItems = false;
  this->SkipItems = false;
  this->Appearing = false;
  this->Hidden = false;
  this->HasCloseButton = false;
  this->ResizeBorderHeld = -1;
  this->BeginCount = 0;
  this->BeginOrderWithinParent = -1;
  this->BeginOrderWithinContext = -1;
  this->PopupId = 0;
  this->AutoFitFramesX = -1;
  this->AutoFitFramesY = -1;
  this->AutoFitChildAxises = '\0';
  this->AutoFitOnlyGrows = false;
  this->AutoPosLastDirection = -1;
  this->HiddenFramesCanSkipItems = 0;
  this->HiddenFramesCannotSkipItems = 0;
  this->SetWindowPosAllowFlags = 0xf;
  (this->SetWindowPosPivot).x = 3.4028235e+38;
  (this->SetWindowPosPivot).y = 3.4028235e+38;
  this->SetWindowSizeAllowFlags = 0xf;
  this->SetWindowCollapsedAllowFlags = 0xf;
  (this->SetWindowPosVal).x = 3.4028235e+38;
  (this->SetWindowPosVal).y = 3.4028235e+38;
  (this->InnerRect).Min.x = 0.0;
  (this->InnerRect).Min.y = 0.0;
  (this->InnerRect).Max.x = 0.0;
  (this->InnerRect).Max.y = 0.0;
  this->LastFrameActive = -1;
  this->LastTimeActive = -1.0;
  this->ItemWidthDefault = 0.0;
  this->FontWindowScale = 1.0;
  this->SettingsIdx = -1;
  this->DrawList = &this->DrawListInst;
  (this->DrawListInst)._OwnerName = this->Name;
  this->ParentWindow = (ImGuiWindow *)0x0;
  this->RootWindow = (ImGuiWindow *)0x0;
  this->RootWindowForTitleBarHighlight = (ImGuiWindow *)0x0;
  this->RootWindowForNav = (ImGuiWindow *)0x0;
  this->NavRectRel[1].Min.x = 3.4028235e+38;
  this->NavRectRel[1].Min.y = 3.4028235e+38;
  this->NavRectRel[1].Max.x = -3.4028235e+38;
  this->NavRectRel[1].Max.y = -3.4028235e+38;
  IVar3 = this->NavRectRel[1].Max;
  this->NavRectRel[0].Min = this->NavRectRel[1].Min;
  this->NavRectRel[0].Max = IVar3;
  this->NavLastChildNavWindow = (ImGuiWindow *)0x0;
  this->NavLastIds[0] = 0;
  this->NavLastIds[1] = 0;
  this->MemoryCompacted = false;
  this->MemoryDrawListIdxCapacity = 0;
  this->MemoryDrawListVtxCapacity = 0;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name)
    : DrawListInst(&context->DrawListSharedData)
{
    Name = ImStrdup(name);
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    Flags = ImGuiWindowFlags_None;
    Pos = ImVec2(0.0f, 0.0f);
    Size = SizeFull = ImVec2(0.0f, 0.0f);
    ContentSize = ContentSizeExplicit = ImVec2(0.0f, 0.0f);
    WindowPadding = ImVec2(0.0f, 0.0f);
    WindowRounding = 0.0f;
    WindowBorderSize = 0.0f;
    NameBufLen = (int)strlen(name) + 1;
    MoveId = GetID("#MOVE");
    ChildId = 0;
    Scroll = ImVec2(0.0f, 0.0f);
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    ScrollbarSizes = ImVec2(0.0f, 0.0f);
    ScrollbarX = ScrollbarY = false;
    Active = WasActive = false;
    WriteAccessed = false;
    Collapsed = false;
    WantCollapseToggle = false;
    SkipItems = false;
    Appearing = false;
    Hidden = false;
    HasCloseButton = false;
    ResizeBorderHeld = -1;
    BeginCount = 0;
    BeginOrderWithinParent = -1;
    BeginOrderWithinContext = -1;
    PopupId = 0;
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoFitChildAxises = 0x00;
    AutoFitOnlyGrows = false;
    AutoPosLastDirection = ImGuiDir_None;
    HiddenFramesCanSkipItems = HiddenFramesCannotSkipItems = 0;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);

    InnerRect = ImRect(0.0f, 0.0f, 0.0f, 0.0f); // Clear so the InnerRect.GetSize() code in Begin() doesn't lead to overflow even if the result isn't used.

    LastFrameActive = -1;
    LastTimeActive = -1.0f;
    ItemWidthDefault = 0.0f;
    FontWindowScale = 1.0f;
    SettingsIdx = -1;

    DrawList = &DrawListInst;
    DrawList->_OwnerName = Name;
    ParentWindow = NULL;
    RootWindow = NULL;
    RootWindowForTitleBarHighlight = NULL;
    RootWindowForNav = NULL;

    NavLastIds[0] = NavLastIds[1] = 0;
    NavRectRel[0] = NavRectRel[1] = ImRect();
    NavLastChildNavWindow = NULL;

    MemoryCompacted = false;
    MemoryDrawListIdxCapacity = MemoryDrawListVtxCapacity = 0;
}